

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::setRealParam
          (SoPlexBase<double> *this,RealParam param,Real value,bool init)

{
  Rational *this_00;
  Verbosity VVar1;
  SPxScaler<double> *pSVar2;
  bool bVar3;
  SPxOut *pSVar4;
  undefined7 in_register_00000011;
  Verbosity old_verbosity;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  *this_01;
  element_type *this_02;
  ulong uVar5;
  Real otol;
  double dVar6;
  double dVar7;
  negate local_61;
  Real local_60;
  Real local_58;
  Real local_50;
  Real local_48;
  Real local_40;
  longdouble local_34;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_28;
  
  uVar5 = (ulong)param;
  if ((int)CONCAT71(in_register_00000011,init) == 0) {
    dVar7 = this->_currentSettings->_realParamValues[uVar5];
    if ((dVar7 == value) && (!NAN(dVar7) && !NAN(value))) {
      return true;
    }
  }
  if ((value < (double)(&DAT_006aadb0)[uVar5]) ||
     ((double)(&DAT_006aae88)[uVar5] <= value && value != (double)(&DAT_006aae88)[uVar5])) {
switchD_001a06e7_default:
    bVar3 = false;
  }
  else {
    switch(uVar5) {
    case 0:
      local_60 = value;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->_rationalFeastol,(longdouble)value);
      Tolerances::setFeastol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 1:
      if (1e-10 <= value) {
        local_58 = value;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)&this->_rationalOpttol,(longdouble)value);
        this_02 = (this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        otol = value;
      }
      else {
        VVar1 = (this->spxout).m_verbosity;
        if (0 < (int)VVar1) {
          (this->spxout).m_verbosity = WARNING;
          pSVar4 = soplex::operator<<(&this->spxout,
                                      "Cannot set optimality tolerance to small value ");
          std::ostream::_M_insert<double>(value);
          pSVar4 = soplex::operator<<(pSVar4," without GMP - using ");
          std::ostream::_M_insert<double>(1e-10);
          soplex::operator<<(pSVar4,".\n");
          (this->spxout).m_verbosity = VVar1;
        }
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)&this->_rationalOpttol,(longdouble)1e-10);
        this_02 = (this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        otol = 1e-10;
      }
      Tolerances::setOpttol(this_02,otol);
      break;
    case 2:
      Tolerances::setEpsilon
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 3:
      Tolerances::setEpsilonFactorization
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 4:
      Tolerances::setEpsilonUpdate
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 5:
      Tolerances::setEpsilonPivot
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 6:
      local_34 = (longdouble)value;
      local_50 = value;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->_rationalPosInfty,local_34);
      this_00 = &this->_rationalNegInfty;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)this_00,local_34);
      local_28.arg = this_00;
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>>
                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  *)this_00,&local_28,&local_61);
      if (this->_currentSettings->_intParamValues[0xf] != 0) {
        _recomputeRangeTypesRational(this);
      }
      break;
    case 7:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x1a:
      break;
    case 8:
    case 9:
      (this->_solver).useTerminationValue = true;
      break;
    case 10:
      Tolerances::setFloatingPointFeastol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 0xb:
      Tolerances::setFloatingPointOpttol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 0xc:
      this_01 = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)&this->_rationalMaxscaleincr;
      local_48 = value;
LAB_001a0872:
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(this_01,(longdouble)value);
      break;
    case 0x16:
      pSVar2 = this->_scaler;
      if (pSVar2 != (SPxScaler<double> *)0x0) {
        (*pSVar2->_vptr_SPxScaler[10])(pSVar2,"realparam");
      }
      break;
    case 0x17:
      if (this->_realLP != (SPxLPBase<double> *)0x0) {
        this->_realLP->offset = value;
      }
      if (this->_rationalLP != (SPxLPRational *)0x0) {
        this_01 = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->_rationalLP->offset;
        local_40 = value;
        goto LAB_001a0872;
      }
      break;
    case 0x18:
      dVar7 = 0.0001;
      if (0.0001 <= value) {
        dVar7 = value;
      }
      dVar6 = 0.9999;
      if (dVar7 <= 0.9999) {
        dVar6 = dVar7;
      }
      (this->_slufactor).minThreshold = dVar6;
      (this->_slufactor).lastThreshold = dVar6;
      break;
    case 0x19:
      dVar7 = this->_currentSettings->_realParamValues[uVar5];
      if ((dVar7 != value) || (NAN(dVar7) || NAN(value))) {
        VVar1 = (this->spxout).m_verbosity;
        if (2 < (int)VVar1) {
          (this->spxout).m_verbosity = INFO1;
          soplex::operator<<(&this->spxout,
                             "Setting Parameter simplifier_modifyrowfac is only possible if SoPlex is build with PaPILO\n"
                            );
          (this->spxout).m_verbosity = VVar1;
        }
        goto switchD_001a06e7_default;
      }
      break;
    default:
      goto switchD_001a06e7_default;
    }
    this->_currentSettings->_realParamValues[uVar5] = value;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::setRealParam(const RealParam param, const Real value, const bool init)
{
   assert(param >= 0);
   assert(param < REALPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == realParam(param))
      return true;

   if(value < _currentSettings->realParam.lower[param]
         || value > _currentSettings->realParam.upper[param])
      return false;

   // required to set a different feastol or opttol
   Real tmp_value = value;

   switch(param)
   {
   // primal feasibility tolerance; passed to the floating point solver only when calling solve()
   case SoPlexBase<R>::FEASTOL:
#ifndef SOPLEX_WITH_BOOST
      if(value < SOPLEX_DEFAULT_EPS_PIVOR)
      {
         SPX_MSG_WARNING(spxout, spxout << "Cannot set feasibility tolerance to small value " << value <<
                         " without GMP - using " << SOPLEX_DEFAULT_EPS_PIVOR << ".\n");
         _rationalFeastol = SOPLEX_DEFAULT_EPS_PIVOR;
         this->_tolerances->setFeastol(SOPLEX_DEFAULT_EPS_PIVOR);
         break;
      }

#endif
      _rationalFeastol = value;
      this->_tolerances->setFeastol(value);
      break;

   // dual feasibility tolerance; passed to the floating point solver only when calling solve()
   case SoPlexBase<R>::OPTTOL:
#ifndef SOPLEX_WITH_GMP
      if(value < SOPLEX_DEFAULT_EPS_PIVOR)
      {
         SPX_MSG_WARNING(spxout, spxout << "Cannot set optimality tolerance to small value " << value <<
                         " without GMP - using " << SOPLEX_DEFAULT_EPS_PIVOR << ".\n");
         _rationalOpttol = SOPLEX_DEFAULT_EPS_PIVOR;
         this->_tolerances->setOpttol(SOPLEX_DEFAULT_EPS_PIVOR);
         break;
      }

#endif
      _rationalOpttol = value;
      this->_tolerances->setOpttol(value);
      break;

   // general zero tolerance
   case SoPlexBase<R>::EPSILON_ZERO:
      _tolerances->setEpsilon(Real(value));
      break;

   // zero tolerance used in factorization
   case SoPlexBase<R>::EPSILON_FACTORIZATION:
      _tolerances->setEpsilonFactorization(Real(value));
      break;

   // zero tolerance used in update of the factorization
   case SoPlexBase<R>::EPSILON_UPDATE:
      _tolerances->setEpsilonUpdate(Real(value));
      break;

   // pivot zero tolerance used in factorization (declare numerical singularity for small LU pivots)
   case SoPlexBase<R>::EPSILON_PIVOT:
      _tolerances->setEpsilonPivot(Real(value));
      break;

   // infinity threshold
   case SoPlexBase<R>::INFTY:
#ifdef SOPLEX_WITH_BOOST
      _rationalPosInfty = value;
      // boost is treating -value as an expression and not just a number<T> So
      // doing -val won't work since Rational doesn't have an operator= that
      // accepts boost expressions. 0-value is a simple fix.

      // @todo Implement expression template?
      // A work around to avoid expression template
      _rationalNegInfty = value;
      _rationalNegInfty = -_rationalNegInfty;
#endif

      if(intParam(SoPlexBase<R>::SYNCMODE) != SYNCMODE_ONLYREAL)
         _recomputeRangeTypesRational();

      break;

   // time limit in seconds (INFTY if unlimited)
   case SoPlexBase<R>::TIMELIMIT:
      break;

   // lower limit on objective value is set in solveReal()
   case SoPlexBase<R>::OBJLIMIT_LOWER:
      this->_solver.toggleTerminationValue(true);
      break;

   // upper limit on objective value is set in solveReal()
   case SoPlexBase<R>::OBJLIMIT_UPPER:
      this->_solver.toggleTerminationValue(true);
      break;

   // working tolerance for feasibility in floating-point solver
   case SoPlexBase<R>::FPFEASTOL:
      this->_tolerances->setFloatingPointFeastol(value);
      break;

   // working tolerance for optimality in floating-point solver
   case SoPlexBase<R>::FPOPTTOL:
      this->_tolerances->setFloatingPointOpttol(value);
      break;

   // maximum increase of scaling factors between refinements
   case SoPlexBase<R>::MAXSCALEINCR:
      _rationalMaxscaleincr = value;
      break;

   // lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)
   case SoPlexBase<R>::LIFTMINVAL:
      break;

   // upper threshold in lifting (nonzero matrix coefficients with larger absolute value will be reformulated)
   case SoPlexBase<R>::LIFTMAXVAL:
      break;

   // threshold for sparse pricing
   case SoPlexBase<R>::SPARSITY_THRESHOLD:
      break;

   // threshold on number of rows vs. number of columns for switching from column to row representations in auto mode
   case SoPlexBase<R>::REPRESENTATION_SWITCH:
      break;

   // geometric frequency at which to apply rational reconstruction
   case SoPlexBase<R>::RATREC_FREQ:
      break;

   // minimal reduction (sum of removed rows/cols) to continue simplification
   case SoPlexBase<R>::MINRED:
      break;

   case SoPlexBase<R>::REFAC_BASIS_NNZ:
      break;

   case SoPlexBase<R>::REFAC_UPDATE_FILL:
      break;

   case SoPlexBase<R>::REFAC_MEM_FACTOR:
      break;

   // accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)
   case SoPlexBase<R>::LEASTSQ_ACRCY:
      if(_scaler)
         _scaler->setRealParam(value);

      break;

   // objective offset
   case SoPlexBase<R>::OBJ_OFFSET:
      if(_realLP)
         _realLP->changeObjOffset(value);

      if(_rationalLP)
         _rationalLP->changeObjOffset(value);

      break;

   case SoPlexBase<R>::MIN_MARKOWITZ:
      _slufactor.setMarkowitz(value);
      break;

   case SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC:
#ifdef SOPLEX_WITH_PAPILO
      _simplifierPaPILO.setModifyConsFrac(value);
#else

      if(_currentSettings->_realParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Setting Parameter simplifier_modifyrowfac is only possible if SoPlex is build with PaPILO\n");
         return false;
      }

#endif
      break;

   // factor by which the precision of the floating-point solver is multiplied
   case SoPlexBase<R>::PRECISION_BOOSTING_FACTOR:
      break;

   default:
      return false;
   }

   _currentSettings->_realParamValues[param] = tmp_value;
   return true;
}